

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_restoreLPReal(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  pointer pnVar1;
  pointer pnVar2;
  pointer pnVar3;
  int iVar4;
  VarStatus VVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  type t;
  longlong local_80;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  if (this->_currentSettings->_intParamValues[0xf] != 2) {
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x29])(this->_realLP,&this->_manualLower,0);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2c])(this->_realLP,&this->_manualUpper,0);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x32])(this->_realLP,&this->_manualLhs,0);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x35])(this->_realLP,&this->_manualRhs,0);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x23])(this->_realLP,&this->_manualObj,0);
    return;
  }
  this_00 = &this->_solver;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::loadLP(this_00,&this->_manualRealLP,true);
  if (this->_hasBasis == true) {
    local_38 = this_00;
    if (0 < (this->_solver).
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar6 = 0;
      lVar8 = 0;
      lVar7 = 0;
      do {
        if (((this->_basisStatusRows).data[lVar7] == FIXED) &&
           (((pnVar1 = (this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)(&(pnVar1->m_backend).data + 1) + lVar6 + 8U) == 2 ||
             (pnVar2 = (this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)(&(pnVar2->m_backend).data + 1) + lVar6 + 8U) == 2)) ||
            (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar1->m_backend).data._M_elems + lVar6),
                                (cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar2->m_backend).data._M_elems + lVar6)), iVar4 != 0)))) {
          if ((this->_hasSolRational == true) && (((this->_solRational).field_0xd0 & 4) != 0)) {
            if (this->_currentSettings->_intParamValues[0] != 1) {
LAB_005e7d17:
              if (this->_currentSettings->_intParamValues[0] == -1) {
                pnVar3 = (this->_solRational)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_80 = 0;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::rational_adaptor<long_long>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_78.ld,&local_80,(type *)0x0);
                iVar4 = boost::multiprecision::backends::
                        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)((long)&(pnVar3->m_backend).m_value.num.m_backend.
                                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                             .m_data + lVar8),
                                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)&local_78.ld);
                if ((local_43 == '\0') && (local_42 == '\0')) {
                  operator_delete(local_50,(ulong)local_58 << 3);
                }
                if ((local_63 == '\0') && (local_62 == '\0')) {
                  operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
                }
                if (iVar4 < 0) goto LAB_005e7dc9;
              }
              goto LAB_005e7d99;
            }
            pnVar3 = (this->_solRational)._dual.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_80 = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_78.ld,&local_80,(type *)0x0);
            iVar4 = boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)((long)&(pnVar3->m_backend).m_value.num.m_backend.
                                         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                         .m_data + lVar8),
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_78.ld);
            if ((local_43 == '\0') && (local_42 == '\0')) {
              operator_delete(local_50,(ulong)local_58 << 3);
            }
            if ((local_63 == '\0') && (local_62 == '\0')) {
              operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
            }
            if (iVar4 < 1) goto LAB_005e7d17;
LAB_005e7dc9:
            VVar5 = ON_UPPER;
          }
          else {
LAB_005e7d99:
            VVar5 = ON_LOWER;
          }
          (this->_basisStatusRows).data[lVar7] = VVar5;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x40;
        lVar6 = lVar6 + 0x80;
      } while (lVar7 < (this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setBasis(local_38,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    this->_hasBasis =
         NO_PROBLEM <
         (this->_solver).
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .thestatus;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_restoreLPReal()
{
   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifndef SOPLEX_MANUAL_ALT
      _solver.loadLP(_manualRealLP);
#else
      _realLP->changeLower(_manualLower);
      _realLP->changeUpper(_manualUpper);
      _realLP->changeLhs(_manualLhs);
      _realLP->changeRhs(_manualRhs);
      _realLP->changeObj(_manualObj);
#endif

      if(_hasBasis)
      {
         // in manual sync mode, if the right-hand side of an equality constraint is not floating-point
         // representable, the user might have constructed the constraint in the real LP by rounding down the
         // left-hand side and rounding up the right-hand side; if the basis status is fixed, we need to adjust it
         for(int i = 0; i < _solver.nRows(); i++)
         {
            if(_basisStatusRows[i] == SPxSolverBase<R>::FIXED && _solver.lhs(i) != _solver.rhs(i))
            {
               assert(_solver.rhs(i) == spxNextafter(_solver.lhs(i), R(infinity)));

               if(_hasSolRational && _solRational.isDualFeasible()
                     && ((intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE
                          && _solRational._dual[i] > 0)
                         || (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                             && _solRational._dual[i] < 0)))
               {
                  _basisStatusRows[i] = SPxSolverBase<R>::ON_UPPER;
               }
               else
               {
                  _basisStatusRows[i] = SPxSolverBase<R>::ON_LOWER;
               }
            }
         }

         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
         _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
      }
   }
   else
   {
      _realLP->changeLower(_manualLower);
      _realLP->changeUpper(_manualUpper);
      _realLP->changeLhs(_manualLhs);
      _realLP->changeRhs(_manualRhs);
      _realLP->changeObj(_manualObj);
   }
}